

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-ssl.c
# Opt level: O0

int lws_ssl_get_error(lws *wsi,int n)

{
  lws_tls_conn *plVar1;
  int *piVar2;
  int m;
  int n_local;
  lws *wsi_local;
  
  if ((wsi->tls).ssl == (lws_tls_conn *)0x0) {
    wsi_local._4_4_ = 99;
  }
  else {
    wsi_local._4_4_ = SSL_get_error((SSL *)(wsi->tls).ssl,n);
    plVar1 = (wsi->tls).ssl;
    piVar2 = __errno_location();
    _lws_log(0x10,"%s: %p %d -> %d (errno %d)\n","lws_ssl_get_error",plVar1,(ulong)(uint)n,
             (ulong)wsi_local._4_4_,*piVar2);
    piVar2 = __errno_location();
    if (*piVar2 == 9) {
      __assert_fail("errno != 9",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/tls/openssl/openssl-ssl.c"
                    ,0x3f,"int lws_ssl_get_error(struct lws *, int)");
    }
  }
  return wsi_local._4_4_;
}

Assistant:

int lws_ssl_get_error(struct lws *wsi, int n)
{
	int m;

	if (!wsi->tls.ssl)
		return 99;

	m = SSL_get_error(wsi->tls.ssl, n);
	lwsl_debug("%s: %p %d -> %d (errno %d)\n", __func__, wsi->tls.ssl, n, m,
		   errno);

	assert (errno != 9);

	return m;
}